

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSC.cpp
# Opt level: O0

void __thiscall CSC::Triplet(CSC *this)

{
  ostream *poVar1;
  int local_18;
  int local_14;
  int j;
  int i;
  CSC *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"CSC:");
  std::operator<<(poVar1,"\n");
  for (local_14 = 0; local_14 < this->col; local_14 = local_14 + 1) {
    for (local_18 = this->ptr[local_14]; local_18 < this->ptr[local_14 + 1]; local_18 = local_18 + 1
        ) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->idx[local_18]);
      std::operator<<(poVar1,"\t");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
      std::operator<<(poVar1,"\t");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->val[local_18]);
      std::operator<<(poVar1,"\n");
    }
  }
  return;
}

Assistant:

void CSC::Triplet()
{
    cout<<"CSC:"<<"\n";
   for(int i=0; i<col; i++)
   {
       for(int j=ptr[i]; j<ptr[i+1]; j++)
       {
           std::cout << idx[j] << "\t"; // row
           std::cout << i << "\t";     //column
           std::cout << val[j] << "\n"; //value
       }
   }
}